

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeVertexGaussianCurvatures
          (IntrinsicGeometryInterface *this)

{
  bool bVar1;
  size_t i;
  Vertex v;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  Vertex local_90;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> local_80;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> local_68;
  MeshData<geometrycentral::surface::Vertex,_double> local_50;
  
  DependentQuantity::ensureHave(&(this->vertexAngleSumsQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Vertex,_double>::MeshData
            (&local_50,(this->super_BaseGeometryInterface).mesh,0.0);
  MeshData<geometrycentral::surface::Vertex,_double>::operator=
            (&this->vertexGaussianCurvatures,&local_50);
  MeshData<geometrycentral::surface::Vertex,_double>::~MeshData(&local_50);
  local_50.mesh = (this->super_BaseGeometryInterface).mesh;
  local_50.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)(local_50.mesh)->nVerticesFillCount;
  local_50.defaultValue = 0.0;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            (&local_80,(RangeSetBase<geometrycentral::surface::VertexRangeF> *)&local_50);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            (&local_68,(RangeSetBase<geometrycentral::surface::VertexRangeF> *)&local_50);
  while (local_80.iCurr != local_68.iCurr) {
    local_90.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
    mesh = local_80.mesh;
    local_90.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
    ind = local_80.iCurr;
    bVar1 = Vertex::isBoundary(&local_90);
    if (!bVar1) {
      (this->vertexGaussianCurvatures).data.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [local_90.
       super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind] =
           6.283185307179586 -
           (this->vertexAngleSums).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [local_90.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind];
    }
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++(&local_80);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeVertexGaussianCurvatures() {
  vertexAngleSumsQ.ensureHave();

  vertexGaussianCurvatures = VertexData<double>(mesh, 0);

  for (Vertex v : mesh.vertices()) {
    if (!v.isBoundary()) {
      vertexGaussianCurvatures[v] = 2. * PI - vertexAngleSums[v];
    }
  }
}